

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O1

int searchwire(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *c,string *value,string *pvalue)

{
  long lVar1;
  pointer pbVar2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  size_type *psVar6;
  ulong uVar7;
  value_type local_50;
  
  pbVar2 = (c->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(c->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    sVar3 = pvalue->_M_string_length;
    psVar6 = &pbVar2->_M_string_length;
    uVar7 = 1;
    do {
      __n = *psVar6;
      if ((__n == sVar3) &&
         ((__n == 0 ||
          (iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar6 + -1))->_M_dataplus)._M_p,(pvalue->_M_dataplus)._M_p,__n),
          iVar4 == 0)))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(c,pbVar2 + (uVar7 & 0xffffffff),value);
        pbVar2 = (c->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,",","");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_insert_rval(c,pbVar2 + (uVar7 & 0xffffffff),&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return 0;
        }
        operator_delete(local_50._M_dataplus._M_p);
        return 0;
      }
      psVar6 = psVar6 + 4;
      lVar1 = uVar7 + (-(ulong)(lVar5 == 0) - lVar5);
      uVar7 = uVar7 + 1;
    } while (lVar1 != 0);
  }
  return 0;
}

Assistant:

int searchwire(vector<string> & c,string *value, string *pvalue)
{
	for (int i = 0;i< c.size(); i++)
	{
		if (c[i] == *pvalue)
		{
			c.insert(c.begin() + (i + 1), *value);
			c.insert(c.begin() + (i + 1), ",");
			return 0;
		}
			
	}
}